

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  uint64_t *puVar1;
  vec<Minisat::Lit> *this_00;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  vec<unsigned_int> *pvVar6;
  ulong *puVar7;
  ulong uVar8;
  int local_48;
  Lit local_44;
  vec<unsigned_int> *local_40;
  SimpSolver *local_38;
  
  if ((this->super_Solver).ok == true) {
    lVar5 = (long)v;
    (this->eliminated).data[lVar5] = '\x01';
    pcVar3 = (this->super_Solver).decision.data;
    if (pcVar3[lVar5] != '\0') {
      puVar1 = &(this->super_Solver).dec_vars;
      *puVar1 = *puVar1 - 1;
    }
    pcVar3[lVar5] = '\0';
    local_48 = v;
    if ((this->occurs).dirty.data[lVar5] != '\0') {
      OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::clean
                (&this->occurs,&local_48);
      lVar5 = (long)local_48;
    }
    pvVar6 = (this->occurs).occs.data;
    bVar4 = true;
    if (0 < pvVar6[lVar5].sz) {
      pvVar6 = pvVar6 + lVar5;
      this_00 = &(this->super_Solver).add_tmp;
      lVar5 = 0;
      local_40 = pvVar6;
      local_38 = this;
      do {
        puVar7 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                          pvVar6->data[lVar5]);
        puVar1 = &(this->super_Solver).statistics.simpSteps;
        *puVar1 = *puVar1 + 1;
        if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
          (this->super_Solver).add_tmp.sz = 0;
        }
        if (*puVar7 >> 0x22 != 0) {
          uVar8 = 0;
          do {
            uVar2 = *(uint *)((long)puVar7 + uVar8 * 4 + 8);
            local_44.x = uVar2 & 1 ^ x.x;
            if ((int)uVar2 >> 1 != local_48) {
              local_44.x = uVar2;
            }
            vec<Minisat::Lit>::push(this_00,&local_44);
            uVar8 = uVar8 + 1;
          } while (uVar8 < *puVar7 >> 0x22);
        }
        this = local_38;
        bVar4 = addClause_(local_38,this_00);
        pvVar6 = local_40;
        if (!bVar4) {
          (this->super_Solver).ok = false;
          goto LAB_0012976a;
        }
        removeClause(this,local_40->data[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar5 < pvVar6->sz);
      bVar4 = true;
    }
  }
  else {
LAB_0012976a:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef> &cls = occurs.lookup(v);

    vec<Lit> &subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++) {
        Clause &c = ca[cls[i]];
        statistics.simpSteps++;

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++) {
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

        if (!addClause_(subst_clause)) return ok = false;

        removeClause(cls[i]);
    }

    return true;
}